

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O1

string * __thiscall
duckdb::UniqueConstraint::ToString_abi_cxx11_(string *__return_storage_ptr__,UniqueConstraint *this)

{
  string *psVar1;
  const_reference text;
  char *pcVar2;
  size_type __n;
  string base;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  string *local_58;
  string local_50;
  
  pcVar2 = "UNIQUE(";
  if ((ulong)this->is_primary_key != 0) {
    pcVar2 = "PRIMARY KEY(";
  }
  local_78 = local_68;
  local_58 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,pcVar2,pcVar2 + (ulong)this->is_primary_key * 5 + 7);
  if ((this->columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)&local_78);
      }
      text = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&this->columns,__n);
      KeywordHelper::WriteOptionallyQuoted(&local_50,text,'\"',true);
      ::std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->columns).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->columns).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  psVar1 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_58,local_78,local_78 + local_70);
  ::std::__cxx11::string::append((char *)psVar1);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return psVar1;
}

Assistant:

string UniqueConstraint::ToString() const {
	string base = is_primary_key ? "PRIMARY KEY(" : "UNIQUE(";
	for (idx_t i = 0; i < columns.size(); i++) {
		if (i > 0) {
			base += ", ";
		}
		base += KeywordHelper::WriteOptionallyQuoted(columns[i]);
	}
	return base + ")";
}